

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O2

InterfaceSchema __thiscall capnp::Schema::asInterface(Schema *this)

{
  Schema SVar1;
  Fault f;
  ArrayPtr<const_char> local_50;
  Reader local_40;
  
  getProto(&local_40,this);
  if ((local_40._reader.dataSize < 0x70) || (*(short *)((long)local_40._reader.data + 0xc) != 3)) {
    getProto(&local_40,this);
    local_50 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_40);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51],capnp::Text::Reader>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema.c++"
               ,0x11d,FAILED,"getProto().isInterface()",
               "\"Tried to use non-interface schema as an interface.\", getProto().getDisplayName()"
               ,(char (*) [51])"Tried to use non-interface schema as an interface.",
               (Reader *)&local_50);
    kj::_::Debug::Fault::~Fault(&f);
    SVar1.raw = (RawBrandedSchema *)(_::NULL_INTERFACE_SCHEMA + 0x48);
  }
  else {
    SVar1 = (Schema)this->raw;
  }
  return (InterfaceSchema)SVar1.raw;
}

Assistant:

InterfaceSchema Schema::asInterface() const {
  KJ_REQUIRE(getProto().isInterface(), "Tried to use non-interface schema as an interface.",
             getProto().getDisplayName()) {
    return InterfaceSchema();
  }
  return InterfaceSchema(*this);
}